

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::ShiftExp(SQParser *this)

{
  long lVar1;
  NestingChecker *pNVar2;
  long in_RDI;
  Expr *lhs;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff68;
  NestingChecker *in_stack_ffffffffffffff70;
  code *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  TreeOp top;
  code *in_stack_ffffffffffffffb0;
  code *in_stack_ffffffffffffffc0;
  SQParser *in_stack_ffffffffffffffe0;
  NestingChecker local_18;
  
  NestingChecker::NestingChecker(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pNVar2 = (NestingChecker *)PlusExp(in_stack_ffffffffffffffe0);
  while( true ) {
    while( true ) {
      while( true ) {
        NestingChecker::inc(in_stack_ffffffffffffff70);
        lVar1 = *(long *)(in_RDI + 0x18);
        top = (TreeOp)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
        if (lVar1 != 0x128) break;
        in_stack_ffffffffffffffb0 = PlusExp;
        pNVar2 = (NestingChecker *)
                 BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                           ((SQParser *)in_stack_ffffffffffffffc0,0x1b9790,top,
                            (Expr *)in_stack_ffffffffffffffa0);
      }
      if (lVar1 != 0x129) break;
      in_stack_ffffffffffffffa0 = PlusExp;
      in_stack_ffffffffffffffa8 = 0;
      in_stack_ffffffffffffff70 =
           (NestingChecker *)
           BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                     ((SQParser *)in_stack_ffffffffffffffc0,
                      (offset_in_SQParser_to_subr)in_stack_ffffffffffffffb0,TO_BLOCK,(Expr *)PlusExp
                     );
      pNVar2 = in_stack_ffffffffffffff70;
    }
    if (lVar1 != 0x132) break;
    in_stack_ffffffffffffffc0 = PlusExp;
    pNVar2 = (NestingChecker *)
             BIN_EXP<SQCompilation::Expr*(SQCompilation::SQParser::*)()>
                       ((SQParser *)PlusExp,(offset_in_SQParser_to_subr)in_stack_ffffffffffffffb0,
                        top,(Expr *)in_stack_ffffffffffffffa0);
  }
  NestingChecker::~NestingChecker(&local_18);
  return (Expr *)pNVar2;
}

Assistant:

Expr* SQParser::ShiftExp()
{
    NestingChecker nc(this);
    Expr *lhs = PlusExp();
    for (;;) {
        nc.inc();
        switch (_token) {
        case TK_USHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_USHR, lhs); break;
        case TK_SHIFTL: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHL, lhs); break;
        case TK_SHIFTR: lhs = BIN_EXP(&SQParser::PlusExp, TO_SHR, lhs); break;
        default: return lhs;
        }
    }
}